

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

ON_2dPoint __thiscall
ON_OBSOLETE_V5_DimAngular::Dim2dPoint(ON_OBSOLETE_V5_DimAngular *this,int point_index)

{
  ON_2dPoint *pOVar1;
  uint uVar2;
  ON_AngularDimension2Extra *pOVar3;
  double dVar4;
  double dVar5;
  ON_2dPoint OVar6;
  ON_2dVector v2;
  double local_50;
  ON_2dPoint local_48;
  ON_2dPoint local_38;
  ON_2dVector local_28;
  
  local_48.y = local_48.x;
  if ((point_index < 0) ||
     ((this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count < 4)
     ) {
switchD_004ad9c4_default:
    local_48.y = -1.23432101234321e+308;
    local_48.x = -1.23432101234321e+308;
    return local_48;
  }
  uVar2 = 0x2713;
  if (((this->super_ON_OBSOLETE_V5_Annotation).m_userpositionedtext & 1U) != 0) {
    uVar2 = 0;
  }
  if (point_index != 10000) {
    uVar2 = point_index;
  }
  if ((int)uVar2 < 4) {
    pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a +
             uVar2;
    local_48.x = pOVar1->x;
    local_48.y = pOVar1->y;
LAB_004ad9a4:
    return local_48;
  }
  switch(uVar2) {
  case 0x2711:
    local_48.y = 0.0;
    local_48.x = this->m_radius;
    return local_48;
  case 0x2712:
    dVar5 = this->m_radius;
    dVar4 = cos(this->m_angle);
    local_48.x = dVar4 * dVar5;
    dVar5 = this->m_angle;
    local_50 = this->m_radius;
    goto LAB_004adace;
  case 0x2713:
    dVar5 = this->m_radius;
    dVar4 = cos(this->m_angle * 0.5);
    local_48.x = dVar4 * dVar5;
    local_50 = this->m_radius;
    dVar5 = this->m_angle * 0.5;
LAB_004adace:
    dVar5 = sin(dVar5);
    local_48.y = dVar5 * local_50;
    return local_48;
  case 0x2714:
    local_48.x = 0.0;
    local_48.y = 0.0;
    goto LAB_004ad9a4;
  case 0x2715:
    local_48 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a
               [1];
    pOVar3 = ON_AngularDimension2Extra::AngularDimensionExtra(this);
    if (pOVar3 != (ON_AngularDimension2Extra *)0x0) {
      dVar5 = pOVar3->m_dimpoint_offset[0];
      goto LAB_004adb15;
    }
    break;
  case 0x2716:
    local_48 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a
               [2];
    pOVar3 = ON_AngularDimension2Extra::AngularDimensionExtra(this);
    if (pOVar3 != (ON_AngularDimension2Extra *)0x0) {
      dVar5 = pOVar3->m_dimpoint_offset[1];
      goto LAB_004adb15;
    }
    break;
  default:
    goto switchD_004ad9c4_default;
  }
  dVar5 = -1.0;
LAB_004adb15:
  if (dVar5 < 0.0) {
    return local_48;
  }
  ON_2dVector::ON_2dVector(&local_28,&local_48);
  ON_2dVector::Unitize(&local_28);
  ON_2dPoint::ON_2dPoint(&local_38,&local_28);
  OVar6 = ON_2dPoint::operator*(&local_38,dVar5);
  return OVar6;
}

Assistant:

ON_2dPoint ON_OBSOLETE_V5_DimAngular::Dim2dPoint( int point_index ) const
{
  ON_2dPoint p2;
  if ( m_points.Count() < dim_pt_count || point_index < 0 )
  {
    p2.x = p2.y = ON_UNSET_VALUE;
  }
  else
  {
    if ( text_pivot_pt == point_index )
    {
      point_index = m_userpositionedtext 
                  ? userpositionedtext_pt_index
                  : arcmid_pt;
    }
    
    if ( point_index < dim_pt_count )
    {
      p2 = m_points[point_index];
    }
    else
    {
      switch(point_index)
      {
      case arcstart_pt:
        p2.x = m_radius;
        p2.y = 0.0;
        break;
      case arcend_pt:
        p2.x = m_radius*cos(m_angle);
        p2.y = m_radius*sin(m_angle);
        break;
      case arccenter_pt:
        p2.x = 0.0;
        p2.y = 0.0;
        break;
      case arcmid_pt:
        p2.x = m_radius*cos(0.5*m_angle);
        p2.y = m_radius*sin(0.5*m_angle);
        break;
      case extension0_pt:
        {
          p2 = m_points[start_pt_index];
          double dp0 = DimpointOffset(0);
          if(dp0 >= 0)
          {
            ON_2dVector v2 = (ON_2dVector)p2;
            v2.Unitize();
            p2 = (ON_2dPoint)v2 * dp0;
          }
        }
        break;
      case extension1_pt:
        {
          p2 = m_points[end_pt_index];
          double dp1 = DimpointOffset(1);
          if(dp1 >= 0)
          {
            ON_2dVector v2 = (ON_2dVector)p2;
            v2.Unitize();
            p2 = (ON_2dPoint)v2 * dp1;
          }
        }
        break;
      default:
        p2.x = p2.y = ON_UNSET_VALUE;
        break;
      }
    }
  }
  return p2;
}